

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int areadfloat(char *file,float **data_ref,int *length_ref)

{
  size_t sVar1;
  undefined1 local_4c [4];
  void *pvStack_48;
  int dummy_length;
  float *data;
  int offset;
  int byterev;
  int ret;
  int length;
  FILE *fp;
  int *length_ref_local;
  float **data_ref_local;
  char *file_local;
  
  fp = (FILE *)length_ref;
  length_ref_local = (int *)data_ref;
  data_ref_local = (float **)file;
  byterev = get_length(file,(int *)((long)&data + 4));
  if (byterev < 0) {
    file_local._4_4_ = -1;
  }
  else {
    _ret = fopen((char *)data_ref_local,"rb");
    if (_ret == (FILE *)0x0) {
      printf("fopen(%s,rb) failed\n",data_ref_local);
      file_local._4_4_ = -1;
    }
    else {
      sVar1 = fread(local_4c,4,1,_ret);
      if (sVar1 == 1) {
        if (length_ref_local == (int *)0x0) {
          fclose(_ret);
          if (fp != (FILE *)0x0) {
            fp->_flags = byterev;
          }
          file_local._4_4_ = byterev;
        }
        else {
          pvStack_48 = calloc((long)byterev,4);
          if (pvStack_48 == (void *)0x0) {
            fprintf(_stderr,"areadfloat: %s: can\'t alloc data\n",data_ref_local);
            fflush(_stdout);
            fclose(_ret);
            file_local._4_4_ = -1;
          }
          else {
            sVar1 = fread(pvStack_48,4,(long)byterev,_ret);
            offset = (int)sVar1;
            if (offset == byterev) {
              fclose(_ret);
              *(void **)length_ref_local = pvStack_48;
              if (data._4_4_ == 1) {
                for (data._0_4_ = 0; (int)data < byterev; data._0_4_ = (int)data + 1) {
                  *(uint *)(*(long *)length_ref_local + (long)(int)data * 4) =
                       *(int *)(*(long *)length_ref_local + (long)(int)data * 4) >> 0x18 & 0xffU |
                       *(int *)(*(long *)length_ref_local + (long)(int)data * 4) >> 8 & 0xff00U |
                       (*(uint *)(*(long *)length_ref_local + (long)(int)data * 4) & 0xff00) << 8 |
                       *(int *)(*(long *)length_ref_local + (long)(int)data * 4) << 0x18;
                }
              }
              fp->_flags = byterev;
              file_local._4_4_ = byterev;
            }
            else {
              fprintf(_stderr,"areadfloat: %s: expected %d, got %d\n",data_ref_local,
                      (ulong)(uint)byterev,sVar1 & 0xffffffff);
              fflush(_stdout);
              fclose(_ret);
              free(pvStack_48);
              file_local._4_4_ = -1;
            }
          }
        }
      }
      else {
        fclose(_ret);
        file_local._4_4_ = -1;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int
areadfloat (char *file,
            float **data_ref,
            int *length_ref)
{
  FILE            *fp;
  int             length;
  int             ret, byterev;
  int             offset;
  float           *data;
  int dummy_length;

  /* Get the file length and whether the file needs to be byte-reversed */
  if ((length = get_length(file, &byterev)) < 0) {
      return -1;
  }
  if ((fp = fopen(file, "rb")) == NULL) {
      printf("fopen(%s,rb) failed\n", file);
      return -1;
  }

  /* Read #floats in header, so we start reading at the right position */
  if (fread(&dummy_length, sizeof(int), 1, fp) != 1) {
      fclose (fp);
      return -1;
  }

  /* Just get the file size if we were not given a buffer. */
  if (data_ref == NULL) {
          fclose(fp);
          if (length_ref)
            *length_ref = length;
          return length;
  }

  if ((data = (float *) calloc (length,sizeof(float))) == NULL)
  {
    fprintf (stderr, "areadfloat: %s: can't alloc data\n", file); 
    fflush(stdout);
    fclose (fp);
    return -1;
  }
  if ((ret = fread(data,sizeof(float),length,fp)) != length)
  {
    fprintf (stderr,"areadfloat: %s: expected %d, got %d\n",file,length,ret);
    fflush(stdout);
    fclose (fp);
    free (data);
    return -1;
  }
  fclose (fp);
  *data_ref = (float *) data;
  if (byterev==1) 
     for(offset = 0; offset < length; offset++) MYSWAP_FLOAT(*data_ref+offset);
  *length_ref = length;
  return length;
}